

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase523::run(TestCase523 *this)

{
  size_t sVar1;
  int iVar2;
  BufferedInputStream *pBVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *pcVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar11;
  ArrayPtr<const_char> AVar12;
  Reader value;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  ReaderOptions options;
  String huge;
  DebugComparison<capnp::Text::Reader,_kj::String_&> local_338;
  TestPipe pipe;
  StructReader local_2c8;
  Reader local_298;
  PointerReader local_278;
  PackedMessageReader reader;
  TestMessageBuilder builder;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  
  kj::heapString(&huge,0x139f);
  pcVar5 = (char *)huge.content.size_;
  if (huge.content.size_ != 0) {
    pcVar5 = huge.content.ptr;
  }
  memset(pcVar5,0x78,0x139f);
  MallocMessageBuilder::MallocMessageBuilder(&builder.super_MallocMessageBuilder,0,FIXED_SIZE);
  builder.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_0036cfc0;
  builder.desiredSegmentCount = 3;
  MessageBuilder::getRootInternal((Builder *)&local_338,(MessageBuilder *)&builder);
  pipe.preferredReadSize = (size_t)local_338.right;
  pipe.super_BufferedInputStream.super_InputStream._vptr_InputStream =
       (InputStream)(InputStream)local_338.left.super_StringPtr.content.ptr;
  pipe.super_OutputStream._vptr_OutputStream =
       (_func_int **)local_338.left.super_StringPtr.content.size_;
  PointerBuilder::initStruct((StructBuilder *)&reader,(PointerBuilder *)&pipe,(StructSize)0x140006);
  pcVar5 = huge.content.ptr;
  if (huge.content.size_ == 0) {
    pcVar5 = "";
  }
  value.super_StringPtr.content.size_ = huge.content.size_ + (huge.content.size_ == 0);
  pipe.super_BufferedInputStream.super_InputStream._vptr_InputStream =
       (InputStream)(InputStream)reader.super_PackedInputStream.super_InputStream._vptr_InputStream;
  pipe.super_OutputStream._vptr_OutputStream = (_func_int **)reader.super_PackedInputStream.inner;
  pipe.preferredReadSize =
       reader.super_InputStreamMessageReader.super_MessageReader.options.traversalLimitInWords;
  value.super_StringPtr.content.ptr = pcVar5;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&pipe,value);
  paVar4 = &pipe.data.field_2;
  pipe.super_BufferedInputStream.super_InputStream._vptr_InputStream =
       (InputStream)&PTR__TestPipe_0036cee8;
  pipe.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__TestPipe_0036cf28;
  pipe.preferredReadSize = 0xffffffffffffffff;
  pipe.data._M_string_length = 0;
  pipe.data.field_2._M_local_buf[0] = '\0';
  pipe.readPos = 0;
  pipe.data._M_dataplus._M_p = (pointer)paVar4;
  AVar11 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&builder);
  segments_01.ptr = (ArrayPtr<const_capnp::word> *)AVar11.size_;
  segments_01.size_ = (size_t)paVar4;
  writePackedMessage((capnp *)&pipe.super_OutputStream,(OutputStream *)AVar11.ptr,segments_01);
  AVar11 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&builder);
  segments.size_ = (ArrayPtr<const_capnp::word> *)AVar11.size_;
  segments.ptr = segments.size_;
  pBVar3 = (BufferedInputStream *)computeSerializedSizeInWords((capnp *)AVar11.ptr,segments);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = (uchar *)pipe.data._M_string_length;
  reader.super_PackedInputStream.inner =
       (BufferedInputStream *)
       computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes);
  reader.super_InputStreamMessageReader.super_MessageReader._vptr_MessageReader =
       (_func_int **)anon_var_dwarf_a914;
  reader.super_InputStreamMessageReader.super_MessageReader.options.traversalLimitInWords = 5;
  reader.super_InputStreamMessageReader.super_MessageReader.options.nestingLimit._0_1_ =
       pBVar3 == reader.super_PackedInputStream.inner;
  reader.super_PackedInputStream.super_InputStream._vptr_InputStream = (_func_int **)pBVar3;
  if ((!(bool)(undefined1)
              reader.super_InputStreamMessageReader.super_MessageReader.options.nestingLimit) &&
     (kj::_::Debug::minSeverity < 3)) {
    AVar11 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&builder);
    segments_00.size_ = (ArrayPtr<const_capnp::word> *)AVar11.size_;
    segments_00.ptr = segments_00.size_;
    local_338.left.super_StringPtr.content.ptr =
         (char *)computeSerializedSizeInWords((capnp *)AVar11.ptr,segments_00);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = (uchar *)pipe.data._M_string_length;
    local_2c8.segment =
         (SegmentReader *)
         computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes_00);
    kj::_::Debug::
    log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x215,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", _kjCondition, computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(DebugComparison<unsigned_long,_unsigned_long> *)&reader,(unsigned_long *)&local_338
               ,(unsigned_long *)&local_2c8);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  PackedMessageReader::PackedMessageReader
            (&reader,&pipe.super_BufferedInputStream,options,(ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRootInternal
            (&local_298,&reader.super_InputStreamMessageReader.super_MessageReader);
  local_278.pointer = local_298.reader.pointer;
  local_278.nestingLimit = local_298.reader.nestingLimit;
  local_278._28_4_ = local_298.reader._28_4_;
  local_278.segment = local_298.reader.segment;
  local_278.capTable = local_298.reader.capTable;
  PointerReader::getStruct(&local_2c8,&local_278,(word *)0x0);
  bVar6 = local_2c8.pointerCount == 0;
  local_278.pointer = local_2c8.pointers;
  if (bVar6) {
    local_278.pointer = (WirePointer *)0x0;
  }
  iVar2 = 0x7fffffff;
  if (!bVar6) {
    iVar2 = local_2c8.nestingLimit;
  }
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  if (!bVar6) {
    uVar7 = local_2c8.segment._0_4_;
    uVar8 = local_2c8.segment._4_4_;
    uVar9 = local_2c8.capTable._0_4_;
    uVar10 = local_2c8.capTable._4_4_;
  }
  local_278.segment = (SegmentReader *)CONCAT44(uVar8,uVar7);
  local_278.capTable = (CapTableReader *)CONCAT44(uVar10,uVar9);
  local_278.nestingLimit = iVar2;
  AVar12 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_278,(void *)0x0,0);
  if (huge.content.size_ + (huge.content.size_ == 0) == AVar12.size_) {
    pcVar5 = huge.content.ptr;
    if (huge.content.size_ == 0) {
      pcVar5 = "";
    }
    iVar2 = bcmp(pcVar5,AVar12.ptr,AVar12.size_);
    local_338.op.content.ptr = " == ";
    local_338.op.content.size_ = 5;
    local_338.result = iVar2 == 0;
    local_338.left.super_StringPtr.content = (StringPtr)(StringPtr)AVar12;
    local_338.right = &huge;
    if (local_338.result) goto LAB_001bda87;
  }
  else {
    local_338.result = false;
  }
  local_338.right = &huge;
  local_338.op.content.size_ = 5;
  local_338.op.content.ptr = " == ";
  local_338.left.super_StringPtr.content = (StringPtr)(StringPtr)AVar12;
  if (kj::_::Debug::minSeverity < 3) {
    local_338.right = &huge;
    local_338.op.content.size_ = 5;
    local_338.op.content.ptr = " == ";
    kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<capnp::Text::Reader,kj::String&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x218,ERROR,
               "\"failed: expected \" \"reader.getRoot<TestAllTypes>().getTextField() == huge\", _kjCondition"
               ,(char (*) [71])
                "failed: expected reader.getRoot<TestAllTypes>().getTextField() == huge",&local_338)
    ;
  }
LAB_001bda87:
  PackedMessageReader::~PackedMessageReader(&reader);
  TestPipe::~TestPipe(&pipe);
  TestMessageBuilder::~TestMessageBuilder(&builder);
  sVar1 = huge.content.size_;
  pcVar5 = huge.content.ptr;
  if (huge.content.ptr != (char *)0x0) {
    huge.content.ptr = (char *)0x0;
    huge.content.size_ = 0;
    (*(code *)**(undefined8 **)huge.content.disposer)(huge.content.disposer,pcVar5,1,sVar1,sVar1,0);
  }
  return;
}

Assistant:

TEST(Packed, RoundTripHugeStringOddSegmentCount) {
  kj::String huge = kj::heapString(5023);
  memset(huge.begin(), 'x', 5023);

  TestMessageBuilder builder(3);
  builder.initRoot<TestAllTypes>().setTextField(huge);

  TestPipe pipe;
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  EXPECT_TRUE(reader.getRoot<TestAllTypes>().getTextField() == huge);
}